

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MunitionDescriptor.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MunitionDescriptor *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  MunitionDescriptor *local_18;
  MunitionDescriptor *this_local;
  
  local_18 = this;
  this_local = (MunitionDescriptor *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Descriptor:");
  poVar1 = std::operator<<(poVar1,"\n\tType:     ");
  EntityType::GetAsString_abi_cxx11_(&local_1d0,&(this->super_Descriptor).m_Type);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\tWarhead:  ");
  ENUMS::GetEnumAsStringWarheadType_abi_cxx11_(&local_1f0,(ENUMS *)(ulong)this->m_ui16Warhead,Value)
  ;
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tFuse:     ");
  ENUMS::GetEnumAsStringFuseType_abi_cxx11_(&local_210,(ENUMS *)(ulong)this->m_ui16Fuse,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\n\tQuantity: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Quantity);
  poVar1 = std::operator<<(poVar1,"\n\tRate:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Rate);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString MunitionDescriptor::GetAsString() const
{
    KStringStream ss;

    ss << "Descriptor:"
       << "\n\tType:     " << m_Type.GetAsString()
       << "\tWarhead:  "   << GetEnumAsStringWarheadType( m_ui16Warhead )
       << "\n\tFuse:     " << GetEnumAsStringFuseType( m_ui16Fuse )
       << "\n\tQuantity: " << m_ui16Quantity
       << "\n\tRate:     " << m_ui16Rate
       << "\n";

    return ss.str();
}